

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::php::anon_unknown_0::PhpGeneratorTest_Basic_Test::
PhpGeneratorTest_Basic_Test(PhpGeneratorTest_Basic_Test *this)

{
  PhpGeneratorTest_Basic_Test *this_local;
  
  PhpGeneratorTest::PhpGeneratorTest(&this->super_PhpGeneratorTest);
  (this->super_PhpGeneratorTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__PhpGeneratorTest_Basic_Test_02a12338;
  return;
}

Assistant:

TEST_F(PhpGeneratorTest, Basic) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto3";
    message Foo {
      optional int32 bar = 1;
      int32 baz = 2;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");

  ExpectNoErrors();
}